

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

void __thiscall wabt::WastLexer::ReadSign(WastLexer *this)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar1 = this->buffer_end_;
  pcVar2 = this->cursor_;
  bVar3 = true;
  if (pcVar2 < pcVar1) {
    if (*pcVar2 == '+') {
      if (pcVar1 <= pcVar2) {
        return;
      }
      goto LAB_0018f052;
    }
    if (pcVar2 < pcVar1) {
      bVar3 = *pcVar2 != '-';
    }
  }
  if (pcVar1 <= pcVar2) {
    return;
  }
  if (bVar3) {
    return;
  }
LAB_0018f052:
  this->cursor_ = pcVar2 + 1;
  return;
}

Assistant:

int WastLexer::PeekChar() {
  return cursor_ < buffer_end_ ? static_cast<uint8_t>(*cursor_) : kEof;
}